

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FieldOptions::InternalSerializeWithCachedSizesToArray
          (FieldOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  UninterpretedOption *this_00;
  void *pvVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = this->ctype_;
    *target = '\b';
    if ((ulong)(long)(int)uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      uVar8 = (ulong)(long)(int)uVar7 >> 7;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar4 = target;
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar4 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar4 = (uint8)uVar9;
      }
    }
  }
  if ((uVar6 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->packed_;
    *target = '\x10';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar6 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->deprecated_;
    *target = '\x18';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar6 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->lazy_;
    *target = '(';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar6 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = this->jstype_;
    *target = '0';
    if ((ulong)(long)(int)uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      uVar8 = (ulong)(long)(int)uVar7 >> 7;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar4 = target;
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar4 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar4 = (uint8)uVar9;
      }
    }
  }
  if ((uVar6 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->weak_;
    *target = 'P';
    target[1] = bVar1;
    target = target + 2;
  }
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (UninterpretedOption *)
                ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_)->elements[iVar10];
      target[0] = 0xba;
      target[1] = '>';
      uVar6 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar6 < 0x80) {
        target[2] = (byte)uVar6;
        puVar4 = target + 3;
      }
      else {
        target[2] = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          target[3] = (uint8)(uVar6 >> 7);
          puVar4 = target + 4;
        }
        else {
          puVar4 = target + 4;
          uVar6 = uVar6 >> 7;
          do {
            puVar5 = puVar4;
            puVar5[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            puVar4 = puVar5 + 1;
            bVar1 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar1);
          *puVar5 = (uint8)uVar7;
        }
      }
      target = UninterpretedOption::InternalSerializeWithCachedSizesToArray(this_00,puVar4,stream);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  puVar4 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target,stream);
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),puVar4,stream);
    return puVar4;
  }
  return puVar4;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FieldOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_ctype(), target);
  }

  // optional bool packed = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(2, this->_internal_packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(5, this->_internal_lazy(), target);
  }

  // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      6, this->_internal_jstype(), target);
  }

  // optional bool weak = 10 [default = false];
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(10, this->_internal_weak(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions)
  return target;
}